

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O3

double ON_SubDSectorType::SectorCoefficientFromTheta(double sector_theta)

{
  undefined *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if ((sector_theta <= 0.0) || (3.141592653589793 < sector_theta)) goto LAB_0062b545;
  dVar2 = cos(sector_theta);
  dVar4 = ABS(dVar2);
  dVar3 = 0.0;
  if (1e-06 < dVar4) {
    if (ABS(dVar4 + -0.5) <= 1e-06) {
      puVar1 = &DAT_006d56a0;
    }
    else {
      dVar3 = dVar2;
      if (dVar4 + 1e-06 < 1.0) goto LAB_0062b4fb;
      puVar1 = &DAT_006994c0;
    }
    dVar3 = *(double *)(puVar1 + (ulong)(dVar2 < 0.0) * 8);
  }
LAB_0062b4fb:
  dVar3 = dVar3 / 3.0 + 0.5;
  if ((0.16666666666666666 < dVar3) && (dVar3 < 0.8333333333333334)) {
    return dVar3;
  }
  if (dVar3 <= 0.16666666666666666) {
    return 0.16666666666666666;
  }
  if (0.8333333333333334 <= dVar3) {
    return 0.8333333333333334;
  }
LAB_0062b545:
  ON_SubDIncrementErrorCount();
  return -9993.0;
}

Assistant:

double ON_SubDSectorType::SectorCoefficientFromTheta(
  double sector_theta
  )
{
  if (!(sector_theta > 0.0 && sector_theta <= ON_PI))
    return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorSectorCoefficient);

  double cos_theta = cos(sector_theta);

  // If cos_theta is near 0, +1/2, -1/2, +1 or -1, then use those values
  // so the weights have the easily identified values associated with the
  // most common cases.
  const double cos_tol = 1e-6;
  const double abs_cos_theta = fabs(cos_theta);
  if (abs_cos_theta <= cos_tol)
    cos_theta = 0.0;
  else if (fabs(abs_cos_theta - 0.5) <= cos_tol)
    cos_theta = (cos_theta < 0.0) ? -0.5 : 0.5;
  else if (abs_cos_theta + cos_tol >= 1.0)
    cos_theta = (cos_theta < 0.0) ? -1.0 : 1.0;

  // Quadrangle case: w = 1/2 + 1/3*cos(theta);
  const double  wrange[2] = { 1.0 / 6.0, 5.0 / 6.0 };
  const double w = 0.5 + cos_theta / 3.0;
  if (w > wrange[0] && w < wrange[1])
    return w;
  if (w <= wrange[0])
    return wrange[0];
  if (w >= wrange[1])
    return wrange[1];

  return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorSectorCoefficient);
}